

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::TestAES256(CryptoTest *this,string *hexkey,string *hexin,string *hexout)

{
  long lVar1;
  uint __line;
  readonly_property65 rVar2;
  bool bVar3;
  char *__assertion;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  const_string file;
  const_string file_00;
  check_type cVar6;
  char *local_310;
  char *local_308;
  assertion_result local_300;
  char **local_2e8;
  assertion_result local_2e0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> correctout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  AES256Decrypt dec;
  AES256Encrypt enc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  ParseHex<unsigned_char>(&key,hex_str);
  hex_str_00._M_str = (hexin->_M_dataplus)._M_p;
  hex_str_00._M_len = hexin->_M_string_length;
  ParseHex<unsigned_char>(&in,hex_str_00);
  hex_str_01._M_str = (hexout->_M_dataplus)._M_p;
  hex_str_01._M_len = hexout->_M_string_length;
  ParseHex<unsigned_char>(&correctout,hex_str_01);
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 0x20) {
    if ((long)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) {
      if ((long)correctout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)correctout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start == 0x10) {
        AES256Encrypt::AES256Encrypt
                  (&enc,key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&buf,(long)correctout.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)correctout.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        AES256Encrypt::Encrypt
                  (&enc,buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                   in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        local_288 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
        ;
        local_280 = "";
        local_298 = &boost::unit_test::basic_cstring<char_const>::null;
        local_290 = &boost::unit_test::basic_cstring<char_const>::null;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        file.m_end = (iterator)0x5b;
        file.m_begin = (iterator)&local_288;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,
                   msg);
        rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)std::operator==(&buf,&correctout);
        local_300.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
        local_300.m_message.px = (element_type *)0x0;
        local_300.m_message.pn.pi_ = (sp_counted_base *)0x0;
        dec.ctx.rk[1].slice._8_8_ = &local_2e0;
        local_2e0._0_8_ = "buf == correctout";
        local_2e0.m_message.px = (element_type *)0xb7a6c5;
        dec.ctx.rk[0].slice[4]._0_1_ = 0;
        dec.ctx.rk[0].slice._0_8_ = &PTR__lazy_ostream_0113a070;
        dec.ctx.rk[1].slice._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_2a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
        ;
        local_2a0 = "";
        pvVar4 = &DAT_00000001;
        pvVar5 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_300,(lazy_ostream *)&dec,1,0,WARN,_cVar6,(size_t)&local_2a8,0x5b);
        boost::detail::shared_count::~shared_count(&local_300.m_message.pn);
        AES256Decrypt::AES256Decrypt
                  (&dec,key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        AES256Decrypt::Decrypt
                  (&dec,buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                   buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        local_2b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
        ;
        local_2b0 = "";
        local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_00.m_end = pvVar5;
        msg_00.m_begin = pvVar4;
        file_00.m_end = (iterator)0x5e;
        file_00.m_begin = (iterator)&local_2b8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2c8
                   ,msg_00);
        bVar3 = std::operator==(&buf,&in);
        local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)bVar3;
        local_2e0.m_message.px = (element_type *)0x0;
        local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_2e8 = &local_310;
        local_310 = "buf == in";
        local_308 = "";
        local_300.m_message.px =
             (element_type *)((ulong)local_300.m_message.px & 0xffffffffffffff00);
        local_300._0_8_ = &PTR__lazy_ostream_0113a070;
        local_300.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2e0,(lazy_ostream *)&local_300,1,0,WARN,0xb6b2b0,
                   (size_t)&stack0xfffffffffffffce0,0x5e);
        boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
        AES256Decrypt::~AES256Decrypt(&dec);
        AES256Encrypt::~AES256Encrypt(&enc);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&correctout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        __stack_chk_fail();
      }
      __assertion = "correctout.size() == 16";
      __line = 0x57;
    }
    else {
      __assertion = "in.size() == 16";
      __line = 0x56;
    }
  }
  else {
    __assertion = "key.size() == 32";
    __line = 0x55;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                ,__line,
                "void crypto_tests::CryptoTest::TestAES256(const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

void TestAES256(const std::string &hexkey, const std::string &hexin, const std::string &hexout)
{
    std::vector<unsigned char> key = ParseHex(hexkey);
    std::vector<unsigned char> in = ParseHex(hexin);
    std::vector<unsigned char> correctout = ParseHex(hexout);
    std::vector<unsigned char> buf;

    assert(key.size() == 32);
    assert(in.size() == 16);
    assert(correctout.size() == 16);
    AES256Encrypt enc(key.data());
    buf.resize(correctout.size());
    enc.Encrypt(buf.data(), in.data());
    BOOST_CHECK(buf == correctout);
    AES256Decrypt dec(key.data());
    dec.Decrypt(buf.data(), buf.data());
    BOOST_CHECK(buf == in);
}